

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseShiftOperator(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *b;
  pool_ref<soul::AST::Expression> local_70;
  char *local_68;
  Op local_5c;
  undefined1 local_58 [4];
  Op type;
  Context context;
  pool_ref<soul::AST::Expression> local_18;
  pool_ref<soul::AST::Expression> a;
  StructuralParser *this_local;
  
  a.object = (Expression *)this;
  pEVar2 = parseAdditionSubtraction(this);
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_18,pEVar2);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)"<<",(TokenType)0x4aecca,(TokenType)">>>");
    if (!bVar1) break;
    getContext((Context *)local_58,this);
    local_68 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       ::skip(&this->super_SOULTokeniser);
    local_5c = getBinaryOpForToken((TokenType)local_68);
    pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
    b = parseAdditionSubtraction(this);
    pEVar2 = createBinaryOperator(this,(Context *)local_58,pEVar2,b,local_5c);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_70,pEVar2);
    local_18.object = local_70.object;
    pool_ref<soul::AST::Expression>::~pool_ref(&local_70);
    AST::Context::~Context((Context *)local_58);
  }
  pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_18);
  return pEVar2;
}

Assistant:

AST::Expression& parseShiftOperator()
    {
        for (pool_ref<AST::Expression> a = parseAdditionSubtraction();;)
        {
            if (! matchesAny (Operator::leftShift, Operator::rightShift, Operator::rightShiftUnsigned))
                return a;

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseAdditionSubtraction(), type);
        }
    }